

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryOpenGL.cpp
# Opt level: O2

void __thiscall
Diligent::EngineFactoryOpenGLImpl::CreateDeviceAndSwapChainGL
          (EngineFactoryOpenGLImpl *this,EngineGLCreateInfo *EngineCI,IRenderDevice **ppDevice,
          IDeviceContext **ppImmediateContext,SwapChainDesc *SCDesc,ISwapChain **ppSwapChain)

{
  IMemoryAllocator *pIVar1;
  DeviceContextGLImpl *this_00;
  SwapChainGLImpl *this_01;
  char (*in_stack_fffffffffffffc38) [2];
  DeviceContextGLImpl *pDeviceContextOpenGL;
  RenderDeviceGLImpl *pRenderDeviceOpenGL;
  IMemoryAllocator *local_3b0;
  IMemoryAllocator *local_3a8;
  char local_3a0 [8];
  char *local_398;
  char *local_390;
  undefined4 local_388;
  DeviceContextDesc local_380;
  string _msg;
  
  if (*(int *)EngineCI == 0x3e808) {
    if ((ppImmediateContext == (IDeviceContext **)0x0 || ppDevice == (IRenderDevice **)0x0) ||
        ppSwapChain == (ISwapChain **)0x0) {
      FormatString<char[22]>(&_msg,(char (*) [22])"Null pointer provided");
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"CreateDeviceAndSwapChainGL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
                 ,0xd4);
    }
    else if (*(int *)(EngineCI + 0x1c) == 0) {
      if (*(uint *)(EngineCI + 0x18) < 2) {
        *ppDevice = (IRenderDevice *)0x0;
        *ppImmediateContext = (IDeviceContext *)0x0;
        *ppSwapChain = (ISwapChain *)0x0;
        GraphicsAdapterInfo::GraphicsAdapterInfo((GraphicsAdapterInfo *)&_msg);
        SetDefaultGraphicsAdapterInfo((GraphicsAdapterInfo *)&_msg);
        VerifyEngineCreateInfo((EngineCreateInfo *)EngineCI,(GraphicsAdapterInfo *)&_msg);
        SetRawAllocator(*(IMemoryAllocator **)(EngineCI + 0x58));
        local_3b0 = GetRawAllocator();
        SetPreferredAdapter(EngineCI);
        pIVar1 = local_3b0;
        local_3a8 = local_3b0;
        local_3a0[0] = '\0';
        local_3a0[1] = '\0';
        local_3a0[2] = '\0';
        local_3a0[3] = '\0';
        local_3a0[4] = '\0';
        local_3a0[5] = '\0';
        local_3a0[6] = '\0';
        local_3a0[7] = '\0';
        local_398 = "TRenderDeviceGLImpl instance";
        local_390 = 
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
        ;
        local_388 = 0xf3;
        pDeviceContextOpenGL = (DeviceContextGLImpl *)SCDesc;
        local_380.Name = (Char *)this;
        pRenderDeviceOpenGL =
             MakeNewRCObj<Diligent::RenderDeviceGLImpl,Diligent::IMemoryAllocator>::operator()
                       ((MakeNewRCObj<Diligent::RenderDeviceGLImpl,Diligent::IMemoryAllocator> *)
                        &local_3a8,local_3b0,(EngineFactoryOpenGLImpl **)&local_380,EngineCI,
                        (SwapChainDesc **)&pDeviceContextOpenGL);
        (**(pRenderDeviceOpenGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
           super_ObjectBase<Diligent::IRenderDeviceGL>.
           super_RefCountedObject<Diligent::IRenderDeviceGL>.super_IRenderDeviceGL.
           super_IRenderDevice.super_IObject._vptr_IObject)
                  (pRenderDeviceOpenGL,IID_RenderDevice,ppDevice);
        local_3a8 = pIVar1;
        local_3a0[0] = '\0';
        local_3a0[1] = '\0';
        local_3a0[2] = '\0';
        local_3a0[3] = '\0';
        local_3a0[4] = '\0';
        local_3a0[5] = '\0';
        local_3a0[6] = '\0';
        local_3a0[7] = '\0';
        local_398 = "DeviceContextGLImpl instance";
        local_390 = 
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
        ;
        local_388 = 0xfa;
        if (*(undefined8 **)(EngineCI + 0x10) == (undefined8 *)0x0) {
          local_380.Name = (Char *)0x0;
        }
        else {
          local_380.Name = (Char *)**(undefined8 **)(EngineCI + 0x10);
        }
        local_380.QueueType = COMMAND_QUEUE_TYPE_GRAPHICS;
        local_380.IsDeferred = false;
        local_380.ContextId = '\0';
        local_380.QueueId = '\0';
        local_380.TextureCopyGranularity[0] = 1;
        local_380.TextureCopyGranularity[1] = 1;
        local_380.TextureCopyGranularity[2] = 1;
        this_00 = MakeNewRCObj<Diligent::DeviceContextGLImpl,Diligent::IMemoryAllocator>::operator()
                            (&local_3a8,&pRenderDeviceOpenGL,&local_380);
        pDeviceContextOpenGL = this_00;
        DeviceContextGLImpl::QueryInterface
                  (this_00,(INTERFACE_ID *)IID_DeviceContext,(IObject **)ppImmediateContext);
        RenderDeviceBase<Diligent::EngineGLImplTraits>::SetImmediateContext
                  (&pRenderDeviceOpenGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,0,
                   this_00);
        local_3a8 = local_3b0;
        local_3a0[0] = '\0';
        local_3a0[1] = '\0';
        local_3a0[2] = '\0';
        local_3a0[3] = '\0';
        local_3a0[4] = '\0';
        local_3a0[5] = '\0';
        local_3a0[6] = '\0';
        local_3a0[7] = '\0';
        local_398 = "SwapChainGLImpl instance";
        local_390 = 
        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/EngineFactoryOpenGL.cpp"
        ;
        local_388 = 0x109;
        this_01 = MakeNewRCObj<Diligent::SwapChainGLImpl,Diligent::IMemoryAllocator>::operator()
                            ((MakeNewRCObj<Diligent::SwapChainGLImpl,Diligent::IMemoryAllocator> *)
                             &local_3a8,EngineCI,SCDesc,&pRenderDeviceOpenGL,&pDeviceContextOpenGL);
        SwapChainGLImpl::QueryInterface
                  (this_01,(INTERFACE_ID *)IID_SwapChain,(IObject **)ppSwapChain);
        DeviceContextGLImpl::SetSwapChain(pDeviceContextOpenGL,(ISwapChainGL *)this_01);
        return;
      }
      FormatString<char[61]>
                (&_msg,(char (*) [61])"OpenGL back-end does not support multiple immediate contexts"
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      FormatString<char[51]>
                (&_msg,(char (*) [51])"OpenGL back-end does not support deferred contexts");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
    }
  }
  else {
    local_3a8 = (IMemoryAllocator *)CONCAT44(local_3a8._4_4_,0x3e808);
    FormatString<char[26],int,char[50],int,char[2]>
              (&_msg,(Diligent *)"Diligent Engine runtime (",(char (*) [26])&local_3a8,
               (int *)") is not compatible with the client API version (",(char (*) [50])EngineCI,
               (int *)0x2caa26,in_stack_fffffffffffffc38);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
  }
  std::__cxx11::string::~string((string *)&_msg);
  return;
}

Assistant:

void EngineFactoryOpenGLImpl::CreateDeviceAndSwapChainGL(const EngineGLCreateInfo& EngineCI,
                                                         IRenderDevice**           ppDevice,
                                                         IDeviceContext**          ppImmediateContext,
                                                         const SwapChainDesc&      SCDesc,
                                                         ISwapChain**              ppSwapChain)
{
    if (EngineCI.EngineAPIVersion != DILIGENT_API_VERSION)
    {
        LOG_ERROR_MESSAGE("Diligent Engine runtime (", DILIGENT_API_VERSION, ") is not compatible with the client API version (", EngineCI.EngineAPIVersion, ")");
        return;
    }

    VERIFY(ppDevice && ppImmediateContext && ppSwapChain, "Null pointer provided");
    if (!ppDevice || !ppImmediateContext || !ppSwapChain)
        return;

    if (EngineCI.NumDeferredContexts > 0)
    {
        LOG_ERROR_MESSAGE("OpenGL back-end does not support deferred contexts");
        return;
    }

    if (EngineCI.NumImmediateContexts > 1)
    {
        LOG_ERROR_MESSAGE("OpenGL back-end does not support multiple immediate contexts");
        return;
    }

    *ppDevice           = nullptr;
    *ppImmediateContext = nullptr;
    *ppSwapChain        = nullptr;

    try
    {
        GraphicsAdapterInfo AdapterInfo;
        SetDefaultGraphicsAdapterInfo(AdapterInfo);
        VerifyEngineCreateInfo(EngineCI, AdapterInfo);

        SetRawAllocator(EngineCI.pRawMemAllocator);
        IMemoryAllocator& RawMemAllocator = GetRawAllocator();

        SetPreferredAdapter(EngineCI);
        RenderDeviceGLImpl* pRenderDeviceOpenGL{
            NEW_RC_OBJ(RawMemAllocator, "TRenderDeviceGLImpl instance", TRenderDeviceGLImpl)(
                RawMemAllocator, this, EngineCI, &SCDesc //
                )                                        //
        };
        pRenderDeviceOpenGL->QueryInterface(IID_RenderDevice, reinterpret_cast<IObject**>(ppDevice));

        DeviceContextGLImpl* pDeviceContextOpenGL{
            NEW_RC_OBJ(RawMemAllocator, "DeviceContextGLImpl instance", DeviceContextGLImpl)(
                pRenderDeviceOpenGL,
                DeviceContextDesc{
                    EngineCI.pImmediateContextInfo ? EngineCI.pImmediateContextInfo[0].Name : nullptr,
                    COMMAND_QUEUE_TYPE_GRAPHICS,
                    False, // IsDeferred
                    0,     // Context id
                    0      // QueueId
                })         //
        };
        // We must call AddRef() (implicitly through QueryInterface()) because pRenderDeviceOpenGL will
        // keep a weak reference to the context
        pDeviceContextOpenGL->QueryInterface(IID_DeviceContext, reinterpret_cast<IObject**>(ppImmediateContext));
        pRenderDeviceOpenGL->SetImmediateContext(0, pDeviceContextOpenGL);

        TSwapChain* pSwapChainGL = NEW_RC_OBJ(RawMemAllocator, "SwapChainGLImpl instance", TSwapChain)(EngineCI, SCDesc, pRenderDeviceOpenGL, pDeviceContextOpenGL);
        pSwapChainGL->QueryInterface(IID_SwapChain, reinterpret_cast<IObject**>(ppSwapChain));

        pDeviceContextOpenGL->SetSwapChain(pSwapChainGL);
    }
    catch (const std::runtime_error&)
    {
        if (*ppDevice)
        {
            (*ppDevice)->Release();
            *ppDevice = nullptr;
        }

        if (*ppImmediateContext)
        {
            (*ppImmediateContext)->Release();
            *ppImmediateContext = nullptr;
        }

        if (*ppSwapChain)
        {
            (*ppSwapChain)->Release();
            *ppSwapChain = nullptr;
        }

        LOG_ERROR("Failed to initialize OpenGL-based render device");
    }
}